

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O2

bool absl::lts_20240722::log_internal::Encode64Bit(uint64_t tag,uint64_t value,Span<char> *buf)

{
  uint64_t value_00;
  size_type n;
  size_t size;
  reference pcVar1;
  size_t s;
  size_type i;
  
  value_00 = tag * 8 + 1;
  size = VarintSize(value_00);
  n = buf->len_;
  if (n < size + 8) {
    Span<char>::remove_suffix(buf,n);
  }
  else {
    anon_unknown_1::EncodeRawVarint(value_00,size,buf);
    for (i = 0; i != 8; i = i + 1) {
      pcVar1 = Span<char>::operator[](buf,i);
      *pcVar1 = (char)value;
      value = value >> 8;
    }
    Span<char>::remove_prefix(buf,8);
  }
  return size + 8 <= n;
}

Assistant:

bool Encode64Bit(uint64_t tag, uint64_t value, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::k64Bit);
  const size_t tag_type_size = VarintSize(tag_type);
  if (tag_type_size + sizeof(value) > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  for (size_t s = 0; s < sizeof(value); s++) {
    (*buf)[s] = static_cast<char>(value & 0xff);
    value >>= 8;
  }
  buf->remove_prefix(sizeof(value));
  return true;
}